

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::AudioEmitter::AudioEmitter(AudioEmitter *this)

{
  allocator local_25 [20];
  allocator local_11;
  AudioEmitter *local_10;
  AudioEmitter *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  this->gain = 1.0;
  this->loop = false;
  this->playing = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->type,"global",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->distanceModel,"inverse",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  PositionalEmitter::PositionalEmitter(&this->positional);
  this->source = -1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions);
  Value::Value(&this->extras);
  std::__cxx11::string::string((string *)&this->extras_json_string);
  std::__cxx11::string::string((string *)&this->extensions_json_string);
  return;
}

Assistant:

AudioEmitter() : type("global"), distanceModel("inverse") {}